

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O3

digit_t Js::JavascriptBigInt::MulDigit(digit_t a,digit_t b,digit_t *resultHigh)

{
  digit_t dVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = (b & 0xffffffff) * (a & 0xffffffff);
  uVar2 = (a & 0xffffffff) * (b >> 0x20);
  uVar4 = (b & 0xffffffff) * (a >> 0x20);
  uVar3 = uVar2 << 0x20;
  dVar1 = ((ulong)(uint)((int)uVar2 + (int)uVar4) << 0x20) + uVar5;
  uVar6 = (ulong)CARRY8(uVar3,uVar5) + 1;
  if (uVar3 + uVar5 <= dVar1) {
    uVar6 = (ulong)CARRY8(uVar3,uVar5);
  }
  *resultHigh = (uVar4 >> 0x20) + (b >> 0x20) * (a >> 0x20) + (uVar2 >> 0x20) + uVar6;
  return dVar1;
}

Assistant:

digit_t JavascriptBigInt::MulDigit(digit_t a, digit_t b, digit_t* resultHigh)
    {
        // Multiply is performed in half chuck favor.
        // For inputs [AH AL]*[BH BL], the result is:
        //
        //            [AL*BL]  // rLow
        //    +    [AL*BH]     // rMid1
        //    +    [AH*BL]     // rMid2
        //    + [AH*BH]        // rHigh
        //    = [R1 R2 R3 R4]  // high = [R1 R2], low = [R3 R4]
        //

        digit_t kHalfDigitBits = sizeof(digit_t) * 4;
        digit_t kHalfDigitMask = ((digit_t)1 << kHalfDigitBits) - 1;

        digit_t aLow = a & kHalfDigitMask;
        digit_t aHigh = a >> kHalfDigitBits;
        digit_t bLow = b & kHalfDigitMask;
        digit_t bHigh = b >> kHalfDigitBits;

        digit_t rLow = aLow * bLow;
        digit_t rMid1 = aLow * bHigh;
        digit_t rMid2 = aHigh * bLow;
        digit_t rHigh = aHigh * bHigh;

        digit_t carry = 0;
        digit_t resultLow = JavascriptBigInt::AddDigit(rLow, rMid1 << kHalfDigitBits, &carry);
        resultLow = JavascriptBigInt::AddDigit(resultLow, rMid2 << kHalfDigitBits, &carry);
        *resultHigh = (rMid1 >> kHalfDigitBits) + (rMid2 >> kHalfDigitBits) + rHigh + carry;
        return resultLow;
    }